

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

void replace_in_place(QString *str,QSpan<unsigned_long,_18446744073709551615UL> indices,
                     qsizetype blen,QStringView after)

{
  unsigned_long uVar1;
  bool bVar2;
  char16_t *pcVar3;
  storage_type_conflict *__n;
  iterator puVar4;
  char16_t *pcVar5;
  reference puVar6;
  QSpan<unsigned_long,_18446744073709551615UL> *pQVar7;
  char16_t *in_RCX;
  QString *in_RDI;
  long in_FS_OFFSET;
  char16_t *movestart_1;
  char16_t *hit_1;
  char16_t *to_1;
  char16_t *moveend;
  char16_t *begin_1;
  qsizetype newSize;
  qsizetype adjust;
  qsizetype oldSize;
  size_t index_1;
  iterator __end3;
  iterator __begin3;
  QSpan<unsigned_long,_18446744073709551615UL> *__range3;
  char16_t *movestart;
  char16_t *to;
  char16_t *hit;
  char16_t *begin;
  size_t index;
  iterator __end2;
  iterator __begin2;
  QSpan<unsigned_long,_18446744073709551615UL> *__range2;
  char16_t *after_e;
  char16_t *after_b;
  qsizetype alen;
  reverse_iterator end;
  reverse_iterator it;
  QSpan<unsigned_long,_18446744073709551615UL> *in_stack_fffffffffffffeb8;
  QArrayDataPointer<char16_t> *in_stack_fffffffffffffec0;
  QSpan<unsigned_long,_18446744073709551615UL> *in_stack_fffffffffffffec8;
  char16_t *in_stack_fffffffffffffed0;
  char16_t *pcVar8;
  char16_t *in_stack_fffffffffffffed8;
  char16_t *in_stack_fffffffffffffee0;
  char16_t *in_stack_fffffffffffffef8;
  iterator local_c0;
  QArrayDataPointer<char16_t> *local_b0;
  iterator local_80;
  reverse_iterator<unsigned_long_*> local_40;
  QSpanBase<unsigned_long,_18446744073709551615UL> local_38;
  QStringView local_28;
  QSpan<unsigned_long,_18446744073709551615UL> local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar3 = (char16_t *)QStringView::size(&local_28);
  QStringView::utf16(&local_28);
  __n = QStringView::utf16(&local_28);
  QStringView::size(&local_28);
  if (in_RCX == pcVar3) {
    local_80 = QSpan<unsigned_long,_18446744073709551615UL>::begin
                         ((QSpan<unsigned_long,_18446744073709551615UL> *)0x15ed8c);
    puVar4 = QSpan<unsigned_long,_18446744073709551615UL>::end
                       ((QSpan<unsigned_long,_18446744073709551615UL> *)in_stack_fffffffffffffec0);
    for (; local_80 != puVar4; local_80 = local_80 + 1) {
      pcVar8 = pcVar3;
      QString::data_ptr(in_RDI);
      QArrayDataPointer<char16_t>::begin((QArrayDataPointer<char16_t> *)0x15edfd);
      std::copy_n<char16_t_const*,long_long,char16_t*>
                (in_stack_fffffffffffffef8,(longlong)__n,pcVar8);
    }
  }
  else if ((long)pcVar3 < (long)in_RCX) {
    QString::data_ptr(in_RDI);
    pcVar5 = QArrayDataPointer<char16_t>::begin((QArrayDataPointer<char16_t> *)0x15ee66);
    pcVar3 = pcVar5;
    puVar6 = QSpan<unsigned_long,_18446744073709551615UL>::front(in_stack_fffffffffffffeb8);
    uVar1 = *puVar6;
    pcVar8 = pcVar3;
    std::copy_n<char16_t_const*,long_long,char16_t*>
              (in_stack_fffffffffffffef8,(longlong)__n,in_stack_fffffffffffffee0);
    local_b0 = (QArrayDataPointer<char16_t> *)(pcVar3 + uVar1 + (long)in_RCX);
    local_38 = (QSpanBase<unsigned_long,_18446744073709551615UL>)
               QSpan<unsigned_long,_18446744073709551615UL>::sliced
                         ((QSpan<unsigned_long,_18446744073709551615UL> *)in_stack_fffffffffffffec0,
                          (size_type_conflict)in_stack_fffffffffffffeb8);
    local_c0 = QSpan<unsigned_long,_18446744073709551615UL>::begin
                         ((QSpan<unsigned_long,_18446744073709551615UL> *)0x15ef45);
    puVar4 = QSpan<unsigned_long,_18446744073709551615UL>::end
                       ((QSpan<unsigned_long,_18446744073709551615UL> *)in_stack_fffffffffffffec0);
    for (; local_c0 != puVar4; local_c0 = local_c0 + 1) {
      uVar1 = *local_c0;
      std::move<char16_t*,char16_t*>
                (pcVar8,(char16_t *)in_stack_fffffffffffffec8,(char16_t *)in_stack_fffffffffffffec0)
      ;
      std::copy_n<char16_t_const*,long_long,char16_t*>
                (in_stack_fffffffffffffef8,(longlong)__n,in_stack_fffffffffffffee0);
      local_b0 = (QArrayDataPointer<char16_t> *)(pcVar5 + uVar1 + (long)in_RCX);
    }
    QString::data_ptr(in_RDI);
    QArrayDataPointer<char16_t>::end(local_b0);
    std::move<char16_t*,char16_t*>
              (pcVar8,(char16_t *)in_stack_fffffffffffffec8,(char16_t *)local_b0);
    std::distance<char16_t*>(in_stack_fffffffffffffed8,pcVar8);
    QString::resize((QString *)local_b0,(qsizetype)in_stack_fffffffffffffeb8);
  }
  else {
    QString::data_ptr(in_RDI);
    QSpan<unsigned_long,_18446744073709551615UL>::size(&local_18);
    QString::resize((QString *)in_stack_fffffffffffffec0,(qsizetype)in_stack_fffffffffffffeb8);
    QString::data_ptr(in_RDI);
    pQVar7 = (QSpan<unsigned_long,_18446744073709551615UL> *)
             QArrayDataPointer<char16_t>::begin((QArrayDataPointer<char16_t> *)0x15f109);
    QString::data_ptr(in_RDI);
    QArrayDataPointer<char16_t>::end(in_stack_fffffffffffffec0);
    local_40.current = (unsigned_long *)0xaaaaaaaaaaaaaaaa;
    QSpan<unsigned_long,_18446744073709551615UL>::rbegin(in_stack_fffffffffffffec8);
    QSpan<unsigned_long,_18446744073709551615UL>::rend(in_stack_fffffffffffffec8);
    while (bVar2 = std::operator!=((reverse_iterator<unsigned_long_*> *)in_stack_fffffffffffffec0,
                                   (reverse_iterator<unsigned_long_*> *)in_stack_fffffffffffffeb8),
          bVar2) {
      in_stack_fffffffffffffeb8 = pQVar7;
      std::reverse_iterator<unsigned_long_*>::operator*(&local_40);
      std::move_backward<char16_t*,char16_t*>
                (in_stack_fffffffffffffed0,(char16_t *)in_stack_fffffffffffffec8,
                 (char16_t *)in_stack_fffffffffffffec0);
      std::copy_backward<char16_t_const*,char16_t*>
                (in_stack_fffffffffffffed0,(char16_t *)in_stack_fffffffffffffec8,
                 (char16_t *)in_stack_fffffffffffffec0);
      std::reverse_iterator<unsigned_long_*>::operator++(&local_40);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void replace_in_place(QString &str, QSpan<size_t> indices,
                             qsizetype blen, QStringView after)
{
    const qsizetype alen = after.size();
    const char16_t *after_b = after.utf16();
    const char16_t *after_e = after.utf16() + after.size();

    if (blen == alen) { // Replace in place
        for (size_t index : indices)
            std::copy_n(after_b, alen, str.data_ptr().begin() + index);
    } else if (blen > alen) { // Replace from front
        char16_t *begin = str.data_ptr().begin();
        char16_t *hit = begin + indices.front();
        char16_t *to = hit;
        to = std::copy_n(after_b, alen, to);
        char16_t *movestart = hit + blen;
        for (size_t index : indices.sliced(1)) {
            hit = begin + index;
            to = std::move(movestart, hit, to);
            to = std::copy_n(after_b, alen, to);
            movestart = hit + blen;
        }
        to = std::move(movestart, str.data_ptr().end(), to);
        str.resize(std::distance(begin, to));
    } else { // blen < alen, Replace from back
        const qsizetype oldSize = str.data_ptr().size;
        const qsizetype adjust = indices.size() * (alen - blen);
        const qsizetype newSize = oldSize + adjust;

        str.resize(newSize);
        char16_t *begin = str.data_ptr().begin();
        char16_t *moveend = begin + oldSize;
        char16_t *to = str.data_ptr().end();

        for (auto it = indices.rbegin(), end = indices.rend(); it != end; ++it) {
            char16_t *hit = begin + *it;
            char16_t *movestart = hit + blen;
            to = std::move_backward(movestart, moveend, to);
            to = std::copy_backward(after_b, after_e, to);
            moveend = hit;
        }
    }
}